

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

ostream * Kernel::operator<<(ostream *out,FuncTerm *self)

{
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  *pRVar1;
  RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
  *pRVar2;
  anon_class_16_2_d708292f f;
  anon_class_16_2_d708292f f_00;
  anon_class_8_1_ba1d6aae local_30;
  
  operator<<(out,&self->_fun);
  pRVar2 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
            *)(self->_args)._stack;
  pRVar1 = (RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
            *)(self->_args)._cursor;
  if (pRVar2 != pRVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
    f.this = (Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
              *)pRVar2;
    f.f = &local_30;
    local_30.out = out;
    ::Lib::CoproductImpl::
    RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
    ::operator<<(pRVar2,f);
    pRVar2 = pRVar2 + 0x18;
    if (pRVar2 != pRVar1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
        f_00.this = (Coproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                     *)pRVar2;
        f_00.f = &local_30;
        local_30.out = out;
        ::Lib::CoproductImpl::
        RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
        ::operator<<(pRVar2,f_00);
        pRVar2 = pRVar2 + 0x18;
      } while (pRVar2 != pRVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Kernel::FuncTerm& self) 
{ 
  out << self._fun;
  auto& stack = self._args;
  auto iter = stack.iterFifo();

  if (iter.hasNext()) {
    out << "(" << iter.next();
    while (iter.hasNext()) {
      out << ", " << iter.next();
    }
    out << ")";
  }

  return out;
}